

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall Shop::addNewMedicine(Shop *this)

{
  ostream *poVar1;
  size_type sVar2;
  undefined1 local_138 [8];
  Medicine medicine;
  int local_98;
  int local_94;
  int quantity;
  int unitPrice;
  string expireDate;
  string local_70 [8];
  string arrivalDate;
  string local_50 [8];
  string companyName;
  string local_30 [8];
  string name;
  Shop *this_local;
  
  std::__cxx11::string::string(local_30);
  std::__cxx11::string::string(local_50);
  std::__cxx11::string::string(local_70);
  std::__cxx11::string::string((string *)&quantity);
  poVar1 = std::operator<<((ostream *)&std::cout,"Enter Medicine Name:");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::operator>>((istream *)&std::cin,local_30);
  poVar1 = std::operator<<((ostream *)&std::cout,"Enter Medicine Company Name:");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::operator>>((istream *)&std::cin,local_50);
  poVar1 = std::operator<<((ostream *)&std::cout,"Enter Unit Price:");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::istream::operator>>((istream *)&std::cin,&local_94);
  poVar1 = std::operator<<((ostream *)&std::cout,"Enter Arrival date:");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::operator>>((istream *)&std::cin,local_70);
  poVar1 = std::operator<<((ostream *)&std::cout,"Enter Expire date:");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::operator>>((istream *)&std::cin,(string *)&quantity);
  poVar1 = std::operator<<((ostream *)&std::cout,"Enter Quantity:");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::istream::operator>>((istream *)&std::cin,&local_98);
  sVar2 = std::vector<Medicine,_std::allocator<Medicine>_>::size(&this->medicineList);
  Medicine::Medicine((Medicine *)local_138,(int)sVar2 + 1,local_94,local_98,false,(string *)local_30
                     ,(string *)local_50,(string *)local_70,(string *)&quantity);
  std::vector<Medicine,_std::allocator<Medicine>_>::push_back
            (&this->medicineList,(value_type *)local_138);
  poVar1 = std::operator<<((ostream *)&std::cout,"Added Medicine, New Medicines List is:");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  printMedicines(this);
  Medicine::~Medicine((Medicine *)local_138);
  std::__cxx11::string::~string((string *)&quantity);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void addNewMedicine() {
        string name, companyName, arrivalDate, expireDate;
        int unitPrice, quantity;
        cout << "Enter Medicine Name:" << endl;
        cin >> name;
        cout << "Enter Medicine Company Name:" << endl;
        cin >> companyName;
        cout << "Enter Unit Price:" << endl;
        cin >> unitPrice;
        cout << "Enter Arrival date:" << endl;
        cin >> arrivalDate;
        cout << "Enter Expire date:" << endl;
        cin >> expireDate;
        cout << "Enter Quantity:" << endl;
        cin >> quantity;

        Medicine medicine = Medicine(medicineList.size() + 1, unitPrice, quantity, false, name, companyName,
                                     arrivalDate, expireDate);

        medicineList.push_back(medicine);

        cout << "Added Medicine, New Medicines List is:" << endl;
        printMedicines();
    }